

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3Unproject(Vector3 source,Matrix projection,Matrix view)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  Vector3 VVar55;
  undefined4 local_188;
  undefined4 local_178;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  undefined4 local_c8;
  undefined4 uStack_c4;
  
  fVar7 = source.z;
  fVar14 = view.m15 * projection.m12 +
           view.m14 * projection.m8 + view.m12 * projection.m0 + projection.m4 * view.m13;
  fVar15 = view.m15 * projection.m13 +
           view.m14 * projection.m9 + view.m12 * projection.m1 + projection.m5 * view.m13;
  fVar26 = view.m15 * projection.m14 +
           view.m14 * projection.m10 + view.m12 * projection.m2 + projection.m6 * view.m13;
  fVar44 = view.m15 * projection.m15 +
           view.m14 * projection.m11 + view.m12 * projection.m3 + view.m13 * projection.m7;
  fVar5 = view.m1;
  fVar6 = view.m5;
  fVar3 = view.m0;
  fVar4 = view.m4;
  fVar1 = view.m2;
  fVar2 = view.m6;
  fVar9 = view.m3;
  fVar10 = view.m7;
  fVar40 = projection.m12 * fVar9 +
           projection.m8 * fVar1 + projection.m0 * fVar3 + projection.m4 * fVar5;
  fVar41 = projection.m12 * fVar10 +
           projection.m8 * fVar2 + projection.m0 * fVar4 + projection.m4 * fVar6;
  fVar42 = projection.m12 * 0.0 + projection.m8 * 0.0 + projection.m0 * 0.0 + projection.m4 * 0.0;
  fVar43 = projection.m12 * 0.0 + projection.m8 * 0.0 + projection.m0 * 0.0 + projection.m4 * 0.0;
  fVar8 = fVar9 * projection.m13 +
          projection.m9 * fVar1 + projection.m1 * fVar3 + projection.m5 * fVar5;
  fVar11 = fVar10 * projection.m13 +
           projection.m9 * fVar2 + projection.m1 * fVar4 + projection.m5 * fVar6;
  fVar12 = projection.m13 * 0.0 + projection.m9 * 0.0 + projection.m1 * 0.0 + projection.m5 * 0.0;
  fVar13 = projection.m13 * 0.0 + projection.m9 * 0.0 + projection.m1 * 0.0 + projection.m5 * 0.0;
  fVar22 = projection.m14 * fVar9 +
           projection.m10 * fVar1 + projection.m2 * fVar3 + projection.m6 * fVar5;
  fVar23 = projection.m14 * fVar10 +
           projection.m10 * fVar2 + projection.m2 * fVar4 + projection.m6 * fVar6;
  fVar24 = projection.m14 * 0.0 + projection.m10 * 0.0 + projection.m2 * 0.0 + projection.m6 * 0.0;
  fVar25 = projection.m14 * 0.0 + projection.m10 * 0.0 + projection.m2 * 0.0 + projection.m6 * 0.0;
  fVar27 = fVar9 * projection.m15 +
           projection.m11 * fVar1 + projection.m3 * fVar3 + projection.m7 * fVar5;
  fVar30 = fVar10 * projection.m15 +
           projection.m11 * fVar2 + projection.m3 * fVar4 + projection.m7 * fVar6;
  fVar32 = projection.m15 * 0.0 + projection.m11 * 0.0 + projection.m3 * 0.0 + projection.m7 * 0.0;
  fVar34 = projection.m15 * 0.0 + projection.m11 * 0.0 + projection.m3 * 0.0 + projection.m7 * 0.0;
  fVar9 = fVar40 * fVar11 - fVar8 * fVar41;
  fVar1 = -fVar26;
  fVar28 = fVar44 * fVar22 + fVar27 * fVar1;
  fVar31 = projection.m12 * view.m11 +
           view.m10 * projection.m8 + view.m8 * projection.m0 + projection.m4 * view.m9;
  fVar33 = fVar24 * 0.0 + fVar30;
  fVar35 = fVar25 * 0.0 + 0.0;
  fVar16 = -fVar14;
  fVar51 = fVar15 * fVar40 + fVar8 * fVar16;
  fVar52 = projection.m14 * view.m11 +
           view.m10 * projection.m10 + view.m8 * projection.m2 + projection.m6 * view.m9;
  fVar53 = fVar42 * 0.0 + fVar11;
  fVar54 = fVar43 * 0.0 + 0.0;
  fVar36 = view.m11 * projection.m13 +
           view.m10 * projection.m9 + view.m8 * projection.m1 + projection.m5 * view.m9;
  fVar37 = fVar23 * fVar44 + fVar30 * fVar1;
  fVar38 = fVar24 * projection.m13 + 0.0;
  fVar39 = fVar25 * 0.0 + fVar30;
  fVar18 = fVar36 * fVar40 - fVar8 * fVar31;
  fVar19 = fVar36 * fVar41 - fVar11 * fVar31;
  fVar20 = fVar36 * fVar42 - fVar12 * fVar31;
  fVar21 = fVar36 * fVar43 - fVar13 * fVar31;
  fVar2 = projection.m15 * view.m11 +
          view.m10 * projection.m11 + view.m8 * projection.m3 + view.m9 * projection.m7;
  fVar4 = fVar15 * fVar41 + fVar11 * fVar16;
  fVar5 = projection.m15 * fVar42 + 0.0;
  fVar6 = fVar43 * 0.0 + fVar11;
  fVar29 = fVar31 * fVar15 - fVar36 * fVar14;
  fVar17 = fVar22 * fVar30 - fVar27 * fVar23;
  fVar45 = fVar2 * fVar22 - fVar27 * fVar52;
  fVar46 = fVar2 * fVar23 - fVar30 * fVar52;
  fVar47 = fVar2 * fVar24 - fVar32 * fVar52;
  fVar48 = fVar2 * fVar25 - fVar34 * fVar52;
  fVar3 = fVar52 * fVar44 - fVar2 * fVar26;
  fVar10 = 1.0 / (fVar29 * fVar17 +
                 ((fVar19 * fVar28 + fVar46 * fVar51 + (fVar9 * fVar3 - fVar37 * fVar18)) -
                 fVar4 * fVar45));
  uStack_e4 = -fVar36;
  local_178 = -fVar41;
  uStack_f4 = -fVar2;
  local_188 = -fVar23;
  local_c8 = source.x;
  uStack_c4 = source.y;
  auVar49._4_4_ =
       (fVar44 * fVar19 + fVar30 * fVar29 + -fVar2 * fVar4) * fVar10 * fVar7 +
       (fVar15 * fVar46 + fVar11 * fVar3 + -fVar36 * fVar37) * fVar10 * local_c8 +
       (fVar16 * fVar46 + -fVar41 * fVar3 + fVar37 * fVar31) * fVar10 * uStack_c4 +
       (fVar1 * fVar19 + -fVar23 * fVar29 + fVar4 * fVar52) * fVar10;
  auVar49._0_4_ =
       (-fVar44 * fVar18 + -fVar27 * fVar29 + fVar51 * fVar2) * fVar10 * fVar7 +
       (-fVar15 * fVar45 + -fVar8 * fVar3 + fVar28 * fVar36) * fVar10 * local_c8 +
       (fVar14 * fVar45 + fVar40 * fVar3 + -fVar31 * fVar28) * fVar10 * uStack_c4 +
       (fVar26 * fVar18 + fVar22 * fVar29 + -fVar52 * fVar51) * fVar10;
  auVar49._8_4_ =
       (projection.m13 * fVar20 + fVar32 * fVar29 + fVar53 * fVar5) * fVar10 * fVar7 +
       (fVar47 * -0.0 + fVar12 * fVar3 + fVar33 * fVar38) * fVar10 * local_c8 +
       (fVar47 * 0.0 + fVar42 * fVar3 + fVar38 * fVar33) * fVar10 * uStack_c4 +
       (fVar20 * 0.0 + fVar24 * fVar29 + fVar5 * fVar53) * fVar10;
  auVar49._12_4_ =
       (fVar44 * fVar21 + fVar34 * fVar29 + fVar54 * fVar6) * fVar10 * fVar7 +
       (fVar48 * 0.0 + fVar13 * fVar3 + fVar35 * fVar39) * fVar10 * local_c8 +
       (fVar48 * -0.0 + fVar43 * fVar3 + fVar39 * fVar35) * fVar10 * uStack_c4 +
       (fVar21 * -0.0 + fVar25 * fVar29 + fVar6 * fVar54) * fVar10;
  fVar2 = fVar7 * (uStack_f4 * fVar9 + -fVar27 * fVar19 + fVar18 * fVar30) * fVar10 +
          (uStack_e4 * fVar17 + -fVar8 * fVar46 + fVar45 * fVar11) * fVar10 * local_c8 +
          (fVar31 * fVar17 + fVar40 * fVar46 + local_178 * fVar45) * fVar10 * uStack_c4 +
          (fVar52 * fVar9 + fVar22 * fVar19 + local_188 * fVar18) * fVar10;
  auVar50._4_4_ = fVar2;
  auVar50._0_4_ = fVar2;
  auVar50._8_4_ = fVar2;
  auVar50._12_4_ = fVar2;
  auVar50 = divps(auVar49,auVar50);
  VVar55.z = (fVar7 * (fVar44 * fVar9 + fVar27 * fVar4 + -fVar30 * fVar51) * fVar10 +
              (fVar15 * fVar17 + fVar8 * fVar37 + -fVar11 * fVar28) * fVar10 * local_c8 +
              (fVar16 * fVar17 + -fVar40 * fVar37 + fVar28 * fVar41) * fVar10 * uStack_c4 +
             (fVar1 * fVar9 + -fVar22 * fVar4 + fVar51 * fVar23) * fVar10) / fVar2;
  VVar55.y = (float)auVar50._0_4_;
  VVar55.x = (float)auVar50._4_4_;
  return VVar55;
}

Assistant:

RMAPI Vector3 Vector3Unproject(Vector3 source, Matrix projection, Matrix view)
{
    Vector3 result = { 0 };

    // Calculate unprojected matrix (multiply view matrix by projection matrix) and invert it
    Matrix matViewProj = {      // MatrixMultiply(view, projection);
        view.m0*projection.m0 + view.m1*projection.m4 + view.m2*projection.m8 + view.m3*projection.m12,
        view.m0*projection.m1 + view.m1*projection.m5 + view.m2*projection.m9 + view.m3*projection.m13,
        view.m0*projection.m2 + view.m1*projection.m6 + view.m2*projection.m10 + view.m3*projection.m14,
        view.m0*projection.m3 + view.m1*projection.m7 + view.m2*projection.m11 + view.m3*projection.m15,
        view.m4*projection.m0 + view.m5*projection.m4 + view.m6*projection.m8 + view.m7*projection.m12,
        view.m4*projection.m1 + view.m5*projection.m5 + view.m6*projection.m9 + view.m7*projection.m13,
        view.m4*projection.m2 + view.m5*projection.m6 + view.m6*projection.m10 + view.m7*projection.m14,
        view.m4*projection.m3 + view.m5*projection.m7 + view.m6*projection.m11 + view.m7*projection.m15,
        view.m8*projection.m0 + view.m9*projection.m4 + view.m10*projection.m8 + view.m11*projection.m12,
        view.m8*projection.m1 + view.m9*projection.m5 + view.m10*projection.m9 + view.m11*projection.m13,
        view.m8*projection.m2 + view.m9*projection.m6 + view.m10*projection.m10 + view.m11*projection.m14,
        view.m8*projection.m3 + view.m9*projection.m7 + view.m10*projection.m11 + view.m11*projection.m15,
        view.m12*projection.m0 + view.m13*projection.m4 + view.m14*projection.m8 + view.m15*projection.m12,
        view.m12*projection.m1 + view.m13*projection.m5 + view.m14*projection.m9 + view.m15*projection.m13,
        view.m12*projection.m2 + view.m13*projection.m6 + view.m14*projection.m10 + view.m15*projection.m14,
        view.m12*projection.m3 + view.m13*projection.m7 + view.m14*projection.m11 + view.m15*projection.m15 };

    // Calculate inverted matrix -> MatrixInvert(matViewProj);
    // Cache the matrix values (speed optimization)
    float a00 = matViewProj.m0, a01 = matViewProj.m1, a02 = matViewProj.m2, a03 = matViewProj.m3;
    float a10 = matViewProj.m4, a11 = matViewProj.m5, a12 = matViewProj.m6, a13 = matViewProj.m7;
    float a20 = matViewProj.m8, a21 = matViewProj.m9, a22 = matViewProj.m10, a23 = matViewProj.m11;
    float a30 = matViewProj.m12, a31 = matViewProj.m13, a32 = matViewProj.m14, a33 = matViewProj.m15;

    float b00 = a00*a11 - a01*a10;
    float b01 = a00*a12 - a02*a10;
    float b02 = a00*a13 - a03*a10;
    float b03 = a01*a12 - a02*a11;
    float b04 = a01*a13 - a03*a11;
    float b05 = a02*a13 - a03*a12;
    float b06 = a20*a31 - a21*a30;
    float b07 = a20*a32 - a22*a30;
    float b08 = a20*a33 - a23*a30;
    float b09 = a21*a32 - a22*a31;
    float b10 = a21*a33 - a23*a31;
    float b11 = a22*a33 - a23*a32;

    // Calculate the invert determinant (inlined to avoid double-caching)
    float invDet = 1.0f/(b00*b11 - b01*b10 + b02*b09 + b03*b08 - b04*b07 + b05*b06);

    Matrix matViewProjInv = {
        (a11*b11 - a12*b10 + a13*b09)*invDet,
        (-a01*b11 + a02*b10 - a03*b09)*invDet,
        (a31*b05 - a32*b04 + a33*b03)*invDet,
        (-a21*b05 + a22*b04 - a23*b03)*invDet,
        (-a10*b11 + a12*b08 - a13*b07)*invDet,
        (a00*b11 - a02*b08 + a03*b07)*invDet,
        (-a30*b05 + a32*b02 - a33*b01)*invDet,
        (a20*b05 - a22*b02 + a23*b01)*invDet,
        (a10*b10 - a11*b08 + a13*b06)*invDet,
        (-a00*b10 + a01*b08 - a03*b06)*invDet,
        (a30*b04 - a31*b02 + a33*b00)*invDet,
        (-a20*b04 + a21*b02 - a23*b00)*invDet,
        (-a10*b09 + a11*b07 - a12*b06)*invDet,
        (a00*b09 - a01*b07 + a02*b06)*invDet,
        (-a30*b03 + a31*b01 - a32*b00)*invDet,
        (a20*b03 - a21*b01 + a22*b00)*invDet };

    // Create quaternion from source point
    Quaternion quat = { source.x, source.y, source.z, 1.0f };

    // Multiply quat point by unprojecte matrix
    Quaternion qtransformed = {     // QuaternionTransform(quat, matViewProjInv)
        matViewProjInv.m0*quat.x + matViewProjInv.m4*quat.y + matViewProjInv.m8*quat.z + matViewProjInv.m12*quat.w,
        matViewProjInv.m1*quat.x + matViewProjInv.m5*quat.y + matViewProjInv.m9*quat.z + matViewProjInv.m13*quat.w,
        matViewProjInv.m2*quat.x + matViewProjInv.m6*quat.y + matViewProjInv.m10*quat.z + matViewProjInv.m14*quat.w,
        matViewProjInv.m3*quat.x + matViewProjInv.m7*quat.y + matViewProjInv.m11*quat.z + matViewProjInv.m15*quat.w };

    // Normalized world points in vectors
    result.x = qtransformed.x/qtransformed.w;
    result.y = qtransformed.y/qtransformed.w;
    result.z = qtransformed.z/qtransformed.w;

    return result;
}